

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_factor.c
# Opt level: O1

int iterFactorConv(mpt_convertable *val,mpt_type_t type,void *ptr)

{
  mpt_iteratorFactor *d;
  uint8_t *puVar1;
  
  if (type == 0x86) {
    if (ptr == (void *)0x0) {
      return 100;
    }
    puVar1 = (uint8_t *)(val + 1);
  }
  else {
    if (type != 0) {
      return -3;
    }
    if (ptr == (void *)0x0) {
      return 0x86;
    }
    puVar1 = iterFactorConv::fmt;
  }
  *(uint8_t **)ptr = puVar1;
  return 100;
}

Assistant:

static int iterFactorConv(MPT_INTERFACE(convertable) *val, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(iteratorFactor) *d = MPT_baseaddr(iteratorFactor, val, _mt);
	if (!type) {
		static const uint8_t fmt[] = { MPT_ENUM(TypeIteratorPtr), 0 };
		if (ptr) {
			*((const uint8_t **) ptr) = fmt;
			return 'd';
		}
		return MPT_ENUM(TypeIteratorPtr);
	}
	if (type == MPT_ENUM(TypeIteratorPtr)) {
		if (ptr) *((const void **) ptr) = (void *) (&d->_it);
		return 'd';
	}
	return MPT_ERROR(BadType);
}